

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FormatterInternal::formatRegister
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,RegType type,
                uint32_t id)

{
  bool bVar1;
  Error EVar2;
  VirtReg *pVVar3;
  VirtReg *pVVar4;
  long lVar5;
  long in_RDX;
  FormatFlags in_ESI;
  String *in_RDI;
  byte in_R8B;
  uint in_R9D;
  bool bVar6;
  TypeEntry *typeEntry_1;
  NameEntry *nameEntry;
  Error _err_2;
  TypeEntry *typeEntry;
  bool formatType;
  Error _err_1;
  Error _err;
  char *name;
  VirtReg *vReg;
  BaseCompiler *cc;
  RegFormatInfo *info;
  char *in_stack_00000230;
  int in_stack_0000023c;
  char *in_stack_00000240;
  uint32_t in_stack_fffffffffffffe3c;
  BaseCompiler *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  ModifyOp op;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  
  op = (ModifyOp)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  if ((((in_R9D - 0x100 < 0xfffffeff) && (in_RDX != 0)) && (*(char *)(in_RDX + 8) == '\x03')) &&
     (in_R9D - 0x100 < *(uint *)(in_RDX + 0x1f0))) {
    pVVar3 = BaseCompiler::virtRegById(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    if (pVVar3 == (VirtReg *)0x0) {
      DebugUtils::assertionFailed(in_stack_00000240,in_stack_0000023c,in_stack_00000230);
    }
    if (*(uint *)(pVVar3 + 0x18) < 0xc) {
      pVVar4 = pVVar3 + 0x1c;
    }
    else {
      pVVar4 = *(VirtReg **)(pVVar3 + 0x20);
    }
    if ((pVVar4 == (VirtReg *)0x0) || (*pVVar4 == (VirtReg)0x0)) {
      EVar2 = String::_opFormat(in_RDI,kAppend,"%%%u",(ulong)(in_R9D - 0x100));
    }
    else {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),op,
                                in_stack_fffffffffffffe58,
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
    if (EVar2 != 0) {
      return EVar2;
    }
    bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(in_ESI,kRegType);
    bVar6 = true;
    if (!bVar1) {
      bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(in_ESI,kRegCasts)
      ;
      bVar6 = false;
      if (bVar1) {
        bVar6 = ((byte)(*(uint *)pVVar3 >> 3) & 0x1f) != in_R8B;
      }
    }
    if (((bVar6) && (in_R8B < 0x20)) &&
       ((x86RegFormatInfo[in_R8B] != 0 &&
        (EVar2 = String::_opFormat(in_RDI,kAppend,"@%s",
                                   (long)(int)(uint)(byte)x86RegFormatInfo[in_R8B] + 0x209ff4),
        EVar2 != 0)))) {
      return EVar2;
    }
    return 0;
  }
  if (in_R8B < 0x20) {
    lVar5 = (ulong)in_R8B * 4;
    if (in_R9D < (byte)x86RegFormatInfo[lVar5 + 0x83]) {
      EVar2 = String::_opString((String *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),op,
                                in_stack_fffffffffffffe58,
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      return EVar2;
    }
    if (in_R9D < (byte)x86RegFormatInfo[lVar5 + 0x80]) {
      EVar2 = String::_opFormat(in_RDI,kAppend,
                                x86RegFormatInfo +
                                (long)(int)(uint)(byte)x86RegFormatInfo[lVar5 + 0x81] + 0x100,
                                (ulong)in_R9D);
      return EVar2;
    }
    if (x86RegFormatInfo[in_R8B] != 0) {
      EVar2 = String::_opFormat(in_RDI,kAppend,"%s@%u",
                                (long)(int)(uint)(byte)x86RegFormatInfo[in_R8B] + 0x209ff4,
                                (ulong)in_R9D);
      return EVar2;
    }
  }
  EVar2 = String::_opFormat(in_RDI,kAppend,"<Reg-%u>?%u",(ulong)in_R8B,(ulong)in_R9D);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(String& sb, FormatFlags formatFlags, const BaseEmitter* emitter, Arch arch, RegType type, uint32_t id) noexcept {
  DebugUtils::unused(arch);
  const RegFormatInfo& info = x86RegFormatInfo;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(id)) {
    if (emitter && emitter->emitterType() == EmitterType::kCompiler) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(id)) {
        VirtReg* vReg = cc->virtRegById(id);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(id))));

        bool formatType = (Support::test(formatFlags, FormatFlags::kRegType)) ||
                          (Support::test(formatFlags, FormatFlags::kRegCasts) && vReg->type() != type);

        if (formatType && uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
          const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
          if (typeEntry.index)
            ASMJIT_PROPAGATE(sb.appendFormat("@%s", info.typeStrings + typeEntry.index));
        }

        return kErrorOk;
      }
    }
  }
#else
  DebugUtils::unused(emitter, formatFlags);
#endif

  if (uint32_t(type) <= uint32_t(RegType::kMaxValue)) {
    const RegFormatInfo::NameEntry& nameEntry = info.nameEntries[size_t(type)];

    if (id < nameEntry.specialCount)
      return sb.append(info.nameStrings + nameEntry.specialIndex + id * 4);

    if (id < nameEntry.count)
      return sb.appendFormat(info.nameStrings + nameEntry.formatIndex, unsigned(id));

    const RegFormatInfo::TypeEntry& typeEntry = info.typeEntries[size_t(type)];
    if (typeEntry.index)
      return sb.appendFormat("%s@%u", info.typeStrings + typeEntry.index, id);
  }

  return sb.appendFormat("<Reg-%u>?%u", uint32_t(type), id);
}